

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_color_picker_behavior
              (nk_flags *state,nk_rect *bounds,nk_rect *matrix,nk_rect *hue_bar,nk_rect *alpha_bar,
              nk_colorf *color,nk_input *in)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  nk_colorf nVar4;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  undefined8 local_60;
  undefined8 local_58;
  int local_4c;
  int hsv_changed;
  int value_changed;
  float hsva [4];
  nk_colorf *color_local;
  nk_rect *alpha_bar_local;
  nk_rect *hue_bar_local;
  nk_rect *matrix_local;
  nk_rect *bounds_local;
  nk_flags *state_local;
  
  local_4c = 0;
  bVar1 = false;
  hsva._8_8_ = color;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5e42,
                  "int nk_color_picker_behavior(nk_flags *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf *, const struct nk_input *)"
                 );
  }
  if (matrix == (nk_rect *)0x0) {
    __assert_fail("matrix",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5e43,
                  "int nk_color_picker_behavior(nk_flags *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf *, const struct nk_input *)"
                 );
  }
  if (hue_bar == (nk_rect *)0x0) {
    __assert_fail("hue_bar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5e44,
                  "int nk_color_picker_behavior(nk_flags *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf *, const struct nk_input *)"
                 );
  }
  if (color != (nk_colorf *)0x0) {
    nk_colorf_hsva_fv((float *)&hsv_changed,*color);
    iVar3 = nk_button_behavior(state,*matrix,in,NK_BUTTON_REPEATER);
    if (iVar3 != 0) {
      if (((in->mouse).pos.x - matrix->x) / (matrix->w - 1.0) <= 1.0) {
        local_64 = ((in->mouse).pos.x - matrix->x) / (matrix->w - 1.0);
      }
      else {
        local_64 = 1.0;
      }
      if (local_64 <= 0.0) {
        local_6c = 0.0;
      }
      else {
        if (((in->mouse).pos.x - matrix->x) / (matrix->w - 1.0) <= 1.0) {
          local_68 = ((in->mouse).pos.x - matrix->x) / (matrix->w - 1.0);
        }
        else {
          local_68 = 1.0;
        }
        local_6c = local_68;
      }
      value_changed = (int)local_6c;
      if (((in->mouse).pos.y - matrix->y) / (matrix->h - 1.0) <= 1.0) {
        local_70 = ((in->mouse).pos.y - matrix->y) / (matrix->h - 1.0);
      }
      else {
        local_70 = 1.0;
      }
      if (local_70 <= 0.0) {
        local_78 = 0.0;
      }
      else {
        if (((in->mouse).pos.y - matrix->y) / (matrix->h - 1.0) <= 1.0) {
          local_74 = ((in->mouse).pos.y - matrix->y) / (matrix->h - 1.0);
        }
        else {
          local_74 = 1.0;
        }
        local_78 = local_74;
      }
      hsva[0] = 1.0 - local_78;
      bVar1 = true;
      local_4c = 1;
    }
    iVar3 = nk_button_behavior(state,*hue_bar,in,NK_BUTTON_REPEATER);
    if (iVar3 != 0) {
      if (((in->mouse).pos.y - hue_bar->y) / (hue_bar->h - 1.0) <= 1.0) {
        local_7c = ((in->mouse).pos.y - hue_bar->y) / (hue_bar->h - 1.0);
      }
      else {
        local_7c = 1.0;
      }
      if (local_7c <= 0.0) {
        local_84 = 0.0;
      }
      else {
        if (((in->mouse).pos.y - hue_bar->y) / (hue_bar->h - 1.0) <= 1.0) {
          local_80 = ((in->mouse).pos.y - hue_bar->y) / (hue_bar->h - 1.0);
        }
        else {
          local_80 = 1.0;
        }
        local_84 = local_80;
      }
      hsv_changed = (int)local_84;
      bVar1 = true;
      local_4c = 1;
    }
    if ((alpha_bar != (nk_rect *)0x0) &&
       (iVar3 = nk_button_behavior(state,*alpha_bar,in,NK_BUTTON_REPEATER), iVar3 != 0)) {
      if (((in->mouse).pos.y - alpha_bar->y) / (alpha_bar->h - 1.0) <= 1.0) {
        local_88 = ((in->mouse).pos.y - alpha_bar->y) / (alpha_bar->h - 1.0);
      }
      else {
        local_88 = 1.0;
      }
      if (local_88 <= 0.0) {
        local_90 = 0.0;
      }
      else {
        if (((in->mouse).pos.y - alpha_bar->y) / (alpha_bar->h - 1.0) <= 1.0) {
          local_8c = ((in->mouse).pos.y - alpha_bar->y) / (alpha_bar->h - 1.0);
        }
        else {
          local_8c = 1.0;
        }
        local_90 = local_8c;
      }
      hsva[1] = 1.0 - local_90;
      local_4c = 1;
    }
    uVar2 = hsva._8_8_;
    if ((*state & 2) == 0) {
      *state = 4;
    }
    else {
      *state = 6;
    }
    if (bVar1) {
      nVar4 = nk_hsva_colorfv((float *)&hsv_changed);
      local_60 = nVar4._0_8_;
      *(undefined8 *)uVar2 = local_60;
      local_58 = nVar4._8_8_;
      *(undefined8 *)(uVar2 + 8) = local_58;
      *state = 0x22;
    }
    if (local_4c != 0) {
      *(float *)(hsva._8_8_ + 0xc) = hsva[1];
      *state = 0x22;
    }
    iVar3 = nk_input_is_mouse_hovering_rect(in,*bounds);
    if (iVar3 != 0) {
      *state = 0x12;
    }
    if (((*state & 0x10) == 0) ||
       (iVar3 = nk_input_is_mouse_prev_hovering_rect(in,*bounds), iVar3 != 0)) {
      iVar3 = nk_input_is_mouse_prev_hovering_rect(in,*bounds);
      if (iVar3 != 0) {
        *state = *state | 0x40;
      }
    }
    else {
      *state = *state | 8;
    }
    return local_4c;
  }
  __assert_fail("color",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5e45,
                "int nk_color_picker_behavior(nk_flags *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf *, const struct nk_input *)"
               );
}

Assistant:

NK_LIB int
nk_color_picker_behavior(nk_flags *state,
    const struct nk_rect *bounds, const struct nk_rect *matrix,
    const struct nk_rect *hue_bar, const struct nk_rect *alpha_bar,
    struct nk_colorf *color, const struct nk_input *in)
{
    float hsva[4];
    int value_changed = 0;
    int hsv_changed = 0;

    NK_ASSERT(state);
    NK_ASSERT(matrix);
    NK_ASSERT(hue_bar);
    NK_ASSERT(color);

    /* color matrix */
    nk_colorf_hsva_fv(hsva, *color);
    if (nk_button_behavior(state, *matrix, in, NK_BUTTON_REPEATER)) {
        hsva[1] = NK_SATURATE((in->mouse.pos.x - matrix->x) / (matrix->w-1));
        hsva[2] = 1.0f - NK_SATURATE((in->mouse.pos.y - matrix->y) / (matrix->h-1));
        value_changed = hsv_changed = 1;
    }
    /* hue bar */
    if (nk_button_behavior(state, *hue_bar, in, NK_BUTTON_REPEATER)) {
        hsva[0] = NK_SATURATE((in->mouse.pos.y - hue_bar->y) / (hue_bar->h-1));
        value_changed = hsv_changed = 1;
    }
    /* alpha bar */
    if (alpha_bar) {
        if (nk_button_behavior(state, *alpha_bar, in, NK_BUTTON_REPEATER)) {
            hsva[3] = 1.0f - NK_SATURATE((in->mouse.pos.y - alpha_bar->y) / (alpha_bar->h-1));
            value_changed = 1;
        }
    }
    nk_widget_state_reset(state);
    if (hsv_changed) {
        *color = nk_hsva_colorfv(hsva);
        *state = NK_WIDGET_STATE_ACTIVE;
    }
    if (value_changed) {
        color->a = hsva[3];
        *state = NK_WIDGET_STATE_ACTIVE;
    }
    /* set color picker widget state */
    if (nk_input_is_mouse_hovering_rect(in, *bounds))
        *state = NK_WIDGET_STATE_HOVERED;
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *bounds))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *bounds))
        *state |= NK_WIDGET_STATE_LEFT;
    return value_changed;
}